

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O2

void * raviX_ptrlist_nth_entry(PtrList *list,uint idx)

{
  PtrList **ppPVar1;
  char cVar2;
  PtrList *pPVar3;
  
  pPVar3 = list;
  if (list != (PtrList *)0x0) {
    do {
      cVar2 = *(char *)pPVar3;
      if (idx < (uint)(int)cVar2) {
        return pPVar3->list_[idx];
      }
      ppPVar1 = &pPVar3->next_;
      pPVar3 = *ppPVar1;
      idx = idx - (int)cVar2;
    } while (*ppPVar1 != list);
  }
  return (void *)0x0;
}

Assistant:

void *raviX_ptrlist_nth_entry(PtrList *list, unsigned int idx)
{
	PtrList *head = list;
	if (!head)
		return NULL;
	do {
		unsigned int nr = list->nr_;
		if (idx < nr)
			return list->list_[idx];
		else
			idx -= nr;
	} while ((list = list->next_) != head);
	return NULL;
}